

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

PixelBufferAccess *
tcu::toSamplerAccess<tcu::PixelBufferAccess>
          (PixelBufferAccess *__return_storage_ptr__,PixelBufferAccess *baseAccess,
          DepthStencilMode mode)

{
  bool bVar1;
  TextureFormat *pTVar2;
  IVec3 *pIVar3;
  IVec3 *pIVar4;
  void *pvVar5;
  TextureFormat local_70;
  TextureFormat local_68;
  TextureFormat local_60;
  TextureFormat local_58;
  TextureFormat local_50;
  TextureFormat local_48;
  TextureFormat local_40;
  TextureFormat local_38;
  undefined4 local_30;
  undefined4 local_2c;
  deUint32 uint32ByteOffsetBits24To32;
  deUint32 uint32ByteOffsetBits16To32;
  deUint32 uint32ByteOffsetBits8To32;
  deUint32 uint32ByteOffsetBits0To24;
  deUint32 uint32ByteOffsetBits0To8;
  DepthStencilMode mode_local;
  PixelBufferAccess *baseAccess_local;
  
  uint32ByteOffsetBits0To24 = mode;
  _uint32ByteOffsetBits0To8 = &baseAccess->super_ConstPixelBufferAccess;
  baseAccess_local = __return_storage_ptr__;
  pTVar2 = ConstPixelBufferAccess::getFormat(&baseAccess->super_ConstPixelBufferAccess);
  bVar1 = isCombinedDepthStencilType(pTVar2->type);
  if (bVar1) {
    uint32ByteOffsetBits8To32 = 0;
    uint32ByteOffsetBits16To32 = 0;
    uint32ByteOffsetBits24To32 = 1;
    local_2c = 2;
    local_30 = 3;
    pTVar2 = ConstPixelBufferAccess::getFormat(_uint32ByteOffsetBits0To8);
    switch(pTVar2->type) {
    case UNSIGNED_INT_16_8_8:
      if (uint32ByteOffsetBits0To24 == 0) {
        TextureFormat::TextureFormat(&local_48,D,UNORM_INT16);
        pIVar3 = ConstPixelBufferAccess::getSize(_uint32ByteOffsetBits0To8);
        pIVar4 = ConstPixelBufferAccess::getPitch(_uint32ByteOffsetBits0To8);
        pvVar5 = PixelBufferAccess::getDataPtr((PixelBufferAccess *)_uint32ByteOffsetBits0To8);
        pvVar5 = addOffset(pvVar5,2);
        PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__,&local_48,pIVar3,pIVar4,pvVar5);
      }
      else if (uint32ByteOffsetBits0To24 == 1) {
        TextureFormat::TextureFormat(&local_50,S,UNSIGNED_INT8);
        pIVar3 = ConstPixelBufferAccess::getSize(_uint32ByteOffsetBits0To8);
        pIVar4 = ConstPixelBufferAccess::getPitch(_uint32ByteOffsetBits0To8);
        pvVar5 = PixelBufferAccess::getDataPtr((PixelBufferAccess *)_uint32ByteOffsetBits0To8);
        pvVar5 = addOffset(pvVar5,0);
        PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__,&local_50,pIVar3,pIVar4,pvVar5);
      }
      else {
        PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__);
      }
      break;
    case UNSIGNED_INT_24_8:
      if (uint32ByteOffsetBits0To24 == 0) {
        TextureFormat::TextureFormat(&local_58,D,UNORM_INT24);
        pIVar3 = ConstPixelBufferAccess::getSize(_uint32ByteOffsetBits0To8);
        pIVar4 = ConstPixelBufferAccess::getPitch(_uint32ByteOffsetBits0To8);
        pvVar5 = PixelBufferAccess::getDataPtr((PixelBufferAccess *)_uint32ByteOffsetBits0To8);
        pvVar5 = addOffset(pvVar5,1);
        PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__,&local_58,pIVar3,pIVar4,pvVar5);
      }
      else if (uint32ByteOffsetBits0To24 == 1) {
        TextureFormat::TextureFormat(&local_60,S,UNSIGNED_INT8);
        pIVar3 = ConstPixelBufferAccess::getSize(_uint32ByteOffsetBits0To8);
        pIVar4 = ConstPixelBufferAccess::getPitch(_uint32ByteOffsetBits0To8);
        pvVar5 = PixelBufferAccess::getDataPtr((PixelBufferAccess *)_uint32ByteOffsetBits0To8);
        pvVar5 = addOffset(pvVar5,0);
        PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__,&local_60,pIVar3,pIVar4,pvVar5);
      }
      else {
        PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__);
      }
      break;
    case UNSIGNED_INT_24_8_REV:
      if (uint32ByteOffsetBits0To24 == 0) {
        TextureFormat::TextureFormat(&local_68,D,UNORM_INT24);
        pIVar3 = ConstPixelBufferAccess::getSize(_uint32ByteOffsetBits0To8);
        pIVar4 = ConstPixelBufferAccess::getPitch(_uint32ByteOffsetBits0To8);
        pvVar5 = PixelBufferAccess::getDataPtr((PixelBufferAccess *)_uint32ByteOffsetBits0To8);
        pvVar5 = addOffset(pvVar5,0);
        PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__,&local_68,pIVar3,pIVar4,pvVar5);
      }
      else if (uint32ByteOffsetBits0To24 == 1) {
        TextureFormat::TextureFormat(&local_70,S,UNSIGNED_INT8);
        pIVar3 = ConstPixelBufferAccess::getSize(_uint32ByteOffsetBits0To8);
        pIVar4 = ConstPixelBufferAccess::getPitch(_uint32ByteOffsetBits0To8);
        pvVar5 = PixelBufferAccess::getDataPtr((PixelBufferAccess *)_uint32ByteOffsetBits0To8);
        pvVar5 = addOffset(pvVar5,3);
        PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__,&local_70,pIVar3,pIVar4,pvVar5);
      }
      else {
        PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__);
      }
      break;
    default:
      PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__);
      break;
    case FLOAT_UNSIGNED_INT_24_8_REV:
      if (uint32ByteOffsetBits0To24 == 0) {
        TextureFormat::TextureFormat(&local_38,D,FLOAT);
        pIVar3 = ConstPixelBufferAccess::getSize(_uint32ByteOffsetBits0To8);
        pIVar4 = ConstPixelBufferAccess::getPitch(_uint32ByteOffsetBits0To8);
        pvVar5 = PixelBufferAccess::getDataPtr((PixelBufferAccess *)_uint32ByteOffsetBits0To8);
        PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__,&local_38,pIVar3,pIVar4,pvVar5);
      }
      else if (uint32ByteOffsetBits0To24 == 1) {
        TextureFormat::TextureFormat(&local_40,S,UNSIGNED_INT8);
        pIVar3 = ConstPixelBufferAccess::getSize(_uint32ByteOffsetBits0To8);
        pIVar4 = ConstPixelBufferAccess::getPitch(_uint32ByteOffsetBits0To8);
        pvVar5 = PixelBufferAccess::getDataPtr((PixelBufferAccess *)_uint32ByteOffsetBits0To8);
        pvVar5 = addOffset(pvVar5,4);
        PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__,&local_40,pIVar3,pIVar4,pvVar5);
      }
      else {
        PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__);
      }
    }
  }
  else {
    PixelBufferAccess::PixelBufferAccess
              (__return_storage_ptr__,(PixelBufferAccess *)_uint32ByteOffsetBits0To8);
  }
  return __return_storage_ptr__;
}

Assistant:

static AccessType toSamplerAccess (const AccessType& baseAccess, Sampler::DepthStencilMode mode)
{
	// make sure to update this if type table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	if (!isCombinedDepthStencilType(baseAccess.getFormat().type))
		return baseAccess;
	else
	{
#if (DE_ENDIANNESS == DE_LITTLE_ENDIAN)
		const deUint32 uint32ByteOffsetBits0To8		= 0; //!< least significant byte in the lowest address
		const deUint32 uint32ByteOffsetBits0To24	= 0;
		const deUint32 uint32ByteOffsetBits8To32	= 1;
		const deUint32 uint32ByteOffsetBits16To32	= 2;
		const deUint32 uint32ByteOffsetBits24To32	= 3;
#else
		const deUint32 uint32ByteOffsetBits0To8		= 3; //!< least significant byte in the highest address
		const deUint32 uint32ByteOffsetBits0To24	= 1;
		const deUint32 uint32ByteOffsetBits8To32	= 0;
		const deUint32 uint32ByteOffsetBits16To32	= 0;
		const deUint32 uint32ByteOffsetBits24To32	= 0;
#endif

		// Sampled channel must exist
		DE_ASSERT(baseAccess.getFormat().order == TextureFormat::DS ||
				  (mode == Sampler::MODE_DEPTH && baseAccess.getFormat().order == TextureFormat::D) ||
				  (mode == Sampler::MODE_STENCIL && baseAccess.getFormat().order == TextureFormat::S));

		// combined formats have multiple channel classes, detect on sampler settings
		switch (baseAccess.getFormat().type)
		{
			case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:
			{
				if (mode == Sampler::MODE_DEPTH)
				{
					// select the float component
					return AccessType(TextureFormat(TextureFormat::D, TextureFormat::FLOAT),
									  baseAccess.getSize(),
									  baseAccess.getPitch(),
									  baseAccess.getDataPtr());
				}
				else if (mode == Sampler::MODE_STENCIL)
				{
					// select the uint 8 component
					return AccessType(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8),
									  baseAccess.getSize(),
									  baseAccess.getPitch(),
									  addOffset(baseAccess.getDataPtr(), 4 + uint32ByteOffsetBits0To8));
				}
				else
				{
					// unknown sampler mode
					DE_ASSERT(false);
					return AccessType();
				}
			}

			case TextureFormat::UNSIGNED_INT_16_8_8:
			{
				if (mode == Sampler::MODE_DEPTH)
				{
					// select the unorm16 component
					return AccessType(TextureFormat(TextureFormat::D, TextureFormat::UNORM_INT16),
									  baseAccess.getSize(),
									  baseAccess.getPitch(),
									  addOffset(baseAccess.getDataPtr(), uint32ByteOffsetBits16To32));
				}
				else if (mode == Sampler::MODE_STENCIL)
				{
					// select the uint 8 component
					return AccessType(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8),
									  baseAccess.getSize(),
									  baseAccess.getPitch(),
									  addOffset(baseAccess.getDataPtr(), uint32ByteOffsetBits0To8));
				}
				else
				{
					// unknown sampler mode
					DE_ASSERT(false);
					return AccessType();
				}
			}

			case TextureFormat::UNSIGNED_INT_24_8:
			{
				if (mode == Sampler::MODE_DEPTH)
				{
					// select the unorm24 component
					return AccessType(TextureFormat(TextureFormat::D, TextureFormat::UNORM_INT24),
									  baseAccess.getSize(),
									  baseAccess.getPitch(),
									  addOffset(baseAccess.getDataPtr(), uint32ByteOffsetBits8To32));
				}
				else if (mode == Sampler::MODE_STENCIL)
				{
					// select the uint 8 component
					return AccessType(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8),
									  baseAccess.getSize(),
									  baseAccess.getPitch(),
									  addOffset(baseAccess.getDataPtr(), uint32ByteOffsetBits0To8));
				}
				else
				{
					// unknown sampler mode
					DE_ASSERT(false);
					return AccessType();
				}
			}

			case TextureFormat::UNSIGNED_INT_24_8_REV:
			{
				if (mode == Sampler::MODE_DEPTH)
				{
					// select the unorm24 component
					return AccessType(TextureFormat(TextureFormat::D, TextureFormat::UNORM_INT24),
									  baseAccess.getSize(),
									  baseAccess.getPitch(),
									  addOffset(baseAccess.getDataPtr(), uint32ByteOffsetBits0To24));
				}
				else if (mode == Sampler::MODE_STENCIL)
				{
					// select the uint 8 component
					return AccessType(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8),
									  baseAccess.getSize(),
									  baseAccess.getPitch(),
									  addOffset(baseAccess.getDataPtr(), uint32ByteOffsetBits24To32));
				}
				else
				{
					// unknown sampler mode
					DE_ASSERT(false);
					return AccessType();
				}
			}

			default:
			{
				// unknown combined format
				DE_ASSERT(false);
				return AccessType();
			}
		}
	}
}